

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int array_container_to_uint32_array(void *vout,array_container_t *cont,uint32_t base)

{
  int local_2c;
  uint32_t val;
  int i;
  uint32_t *out;
  int outpos;
  uint32_t base_local;
  array_container_t *cont_local;
  void *vout_local;
  
  out._0_4_ = 0;
  for (local_2c = 0; local_2c < cont->cardinality; local_2c = local_2c + 1) {
    *(uint32_t *)((long)vout + (long)(int)out * 4) = base + cont->array[local_2c];
    out._0_4_ = (int)out + 1;
  }
  return (int)out;
}

Assistant:

int array_container_to_uint32_array(void *vout, const array_container_t *cont,
                                    uint32_t base) {
    int outpos = 0;
    uint32_t *out = (uint32_t *)vout;
    for (int i = 0; i < cont->cardinality; ++i) {
        const uint32_t val = base + cont->array[i];
        memcpy(out + outpos, &val,
               sizeof(uint32_t));  // should be compiled as a MOV on x64
        outpos++;
    }
    return outpos;
}